

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Vdbe *p;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint addr;
  int addr_00;
  long lVar4;
  int target;
  char affinity;
  int rRhsHasNull;
  char local_41;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  local_40 = 0;
  p = pParse->pVdbe;
  local_38 = sqlite3FindInIndex(pParse,pExpr,&local_40);
  local_41 = comparisonAffinity(pExpr);
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  if (pParse->nTempReg == '\0') {
    target = pParse->nMem + 1;
    pParse->nMem = target;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    target = pParse->aTempReg[bVar1];
  }
  sqlite3ExprCode(pParse,pExpr->pLeft,target);
  local_34 = destIfFalse;
  if (destIfNull == destIfFalse) {
    sqlite3VdbeAddOp3(p,0x49,target,destIfNull,0);
  }
  else {
    local_3c = sqlite3VdbeAddOp3(p,0x4a,target,0,0);
    sqlite3VdbeAddOp3(p,0x48,pExpr->iTable,destIfFalse,0);
    sqlite3VdbeAddOp3(p,1,0,destIfNull,0);
    if ((-1 < (int)local_3c) && (local_3c < (uint)p->nOp)) {
      p->aOp[local_3c].p2 = p->nOp;
    }
  }
  iVar2 = local_34;
  if (local_38 == 1) {
    sqlite3VdbeAddOp3(p,0x15,target,local_34,0);
    addr_00 = 0x36;
    sqlite3VdbeAddOp3(p,0x36,pExpr->iTable,iVar2,target);
  }
  else {
    iVar2 = sqlite3VdbeAddOp3(p,0x1e,target,1,0);
    sqlite3VdbeChangeP4(p,iVar2,&local_41,1);
    iVar2 = local_34;
    if ((destIfNull == local_34) || (local_40 == 0)) {
      addr_00 = sqlite3VdbeAddOp3(p,0x33,pExpr->iTable,local_34,target);
      sqlite3VdbeChangeP4(p,addr_00,(char *)0x1,-0xe);
    }
    else {
      local_38 = destIfNull;
      local_3c = sqlite3VdbeAddOp3(p,0x34,pExpr->iTable,0,target);
      sqlite3VdbeChangeP4(p,local_3c,(char *)0x1,-0xe);
      uVar3 = sqlite3VdbeAddOp3(p,0x4a,local_40,0,0);
      addr = sqlite3VdbeAddOp3(p,0x34,pExpr->iTable,0,local_40);
      sqlite3VdbeChangeP4(p,addr,(char *)0x1,-0xe);
      sqlite3VdbeAddOp3(p,7,-1,local_40,0);
      if ((-1 < (int)addr) && (addr < (uint)p->nOp)) {
        p->aOp[addr].p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x14,local_40,1,0);
      if ((-1 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
        p->aOp[uVar3].p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x1b,local_40,local_38,0);
      addr_00 = 1;
      sqlite3VdbeAddOp3(p,1,0,iVar2,0);
      if ((-1 < (int)local_3c) && (local_3c < (uint)p->nOp)) {
        p->aOp[local_3c].p2 = p->nOp;
      }
    }
  }
  if (target != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar4 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar4) == target) {
          (&pParse->aColCache[0].tempReg)[lVar4] = '\x01';
          goto LAB_00196466;
        }
        lVar4 = lVar4 + 0x18;
      } while ((int)lVar4 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = target;
    }
  }
LAB_00196466:
  sqlite3ExprCachePop(pParse,addr_00);
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  char affinity;        /* Comparison affinity to use */
  int eType;            /* Type of the RHS */
  int r1;               /* Temporary use register */
  Vdbe *v;              /* Statement under construction */

  /* Compute the RHS.   After this step, the table with cursor
  ** pExpr->iTable will contains the values that make up the RHS.
  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr, &rRhsHasNull);

  /* Figure out the affinity to use to create a key from the results
  ** of the expression. affinityStr stores a static string suitable for
  ** P4 of OP_MakeRecord.
  */
  affinity = comparisonAffinity(pExpr);

  /* Code the LHS, the <expr> from "<expr> IN (...)".
  */
  sqlite3ExprCachePush(pParse);
  r1 = sqlite3GetTempReg(pParse);
  sqlite3ExprCode(pParse, pExpr->pLeft, r1);

  /* If the LHS is NULL, then the result is either false or NULL depending
  ** on whether the RHS is empty or not, respectively.
  */
  if( destIfNull==destIfFalse ){
    /* Shortcut for the common case where the false and NULL outcomes are
    ** the same. */
    sqlite3VdbeAddOp2(v, OP_IsNull, r1, destIfNull);
  }else{
    int addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, r1);
    sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
    sqlite3VdbeJumpHere(v, addr1);
  }

  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree
    */
    sqlite3VdbeAddOp2(v, OP_MustBeInt, r1, destIfFalse);
    sqlite3VdbeAddOp3(v, OP_NotExists, pExpr->iTable, destIfFalse, r1);
  }else{
    /* In this case, the RHS is an index b-tree.
    */
    sqlite3VdbeAddOp4(v, OP_Affinity, r1, 1, 0, &affinity, 1);

    /* If the set membership test fails, then the result of the 
    ** "x IN (...)" expression must be either 0 or NULL. If the set
    ** contains no NULL values, then the result is 0. If the set 
    ** contains one or more NULL values, then the result of the
    ** expression is also NULL.
    */
    if( rRhsHasNull==0 || destIfFalse==destIfNull ){
      /* This branch runs if it is known at compile time that the RHS
      ** cannot contain NULL values. This happens as the result
      ** of a "NOT NULL" constraint in the database schema.
      **
      ** Also run this branch if NULL is equivalent to FALSE
      ** for this particular IN operator.
      */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse, r1, 1);

    }else{
      /* In this branch, the RHS of the IN might contain a NULL and
      ** the presence of a NULL on the RHS makes a difference in the
      ** outcome.
      */
      int j1, j2, j3;

      /* First check to see if the LHS is contained in the RHS.  If so,
      ** then the presence of NULLs in the RHS does not matter, so jump
      ** over all of the code that follows.
      */
      j1 = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0, r1, 1);

      /* Here we begin generating code that runs if the LHS is not
      ** contained within the RHS.  Generate additional code that
      ** tests the RHS for NULLs.  If the RHS contains a NULL then
      ** jump to destIfNull.  If there are no NULLs in the RHS then
      ** jump to destIfFalse.
      */
      j2 = sqlite3VdbeAddOp1(v, OP_NotNull, rRhsHasNull);
      j3 = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0, rRhsHasNull, 1);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, rRhsHasNull);
      sqlite3VdbeJumpHere(v, j3);
      sqlite3VdbeAddOp2(v, OP_AddImm, rRhsHasNull, 1);
      sqlite3VdbeJumpHere(v, j2);

      /* Jump to the appropriate target depending on whether or not
      ** the RHS contains a NULL
      */
      sqlite3VdbeAddOp2(v, OP_If, rRhsHasNull, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);

      /* The OP_Found at the top of this branch jumps here when true, 
      ** causing the overall IN expression evaluation to fall through.
      */
      sqlite3VdbeJumpHere(v, j1);
    }
  }
  sqlite3ReleaseTempReg(pParse, r1);
  sqlite3ExprCachePop(pParse, 1);
  VdbeComment((v, "end IN expr"));
}